

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
boost::exception_detail::
clone_impl<boost::exception_detail::error_info_injector<std::invalid_argument>_>::clone_impl
          (void *param_1,exception *param_2)

{
  error_info_injector<std::invalid_argument> *in_stack_ffffffffffffffc8;
  exception *a;
  
  a = (exception *)param_1;
  clone_base::clone_base((clone_base *)((long)param_1 + 0x38));
  error_info_injector<std::invalid_argument>::error_info_injector
            ((error_info_injector<std::invalid_argument> *)param_1,in_stack_ffffffffffffffc8);
  *(undefined8 *)param_1 = 0x150948;
  (((error_info_injector<std::invalid_argument> *)param_1)->super_exception)._vptr_exception =
       (_func_int **)0x150980;
  *(undefined8 *)((long)param_1 + 0x38) = 0x1509b8;
  copy_boost_exception(a,param_2);
  return;
}

Assistant:

clone_impl( clone_impl const & x, clone_tag ):
                T(x)
                {
                copy_boost_exception(this,&x);
                }